

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void prescan_quantize(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows
                     )

{
  short sVar1;
  JDIMENSION JVar2;
  _func_void_j_decompress_ptr *p_Var3;
  short *psVar4;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  hist3d histogram;
  histptr histp;
  JSAMPROW ptr;
  my_cquantize_ptr_conflict cquantize;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JSAMPARRAY input_buf_local;
  j_decompress_ptr cinfo_local;
  
  p_Var3 = cinfo->cquantize[1].finish_pass;
  JVar2 = cinfo->output_width;
  for (row = 0; row < num_rows; row = row + 1) {
    ptr = input_buf[row];
    for (col = JVar2; col != 0; col = col - 1) {
      psVar4 = (short *)(*(long *)(p_Var3 + (long)((int)(uint)*ptr >> 3) * 8) +
                         (long)((int)(uint)ptr[1] >> 2) * 0x40 + (long)((int)(uint)ptr[2] >> 3) * 2)
      ;
      sVar1 = *psVar4;
      *psVar4 = sVar1 + 1;
      if ((short)(sVar1 + 1) == 0) {
        *psVar4 = *psVar4 + -1;
      }
      ptr = ptr + 3;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
prescan_quantize(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                 JSAMPARRAY output_buf, int num_rows)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  register JSAMPROW ptr;
  register histptr histp;
  register hist3d histogram = cquantize->histogram;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    ptr = input_buf[row];
    for (col = width; col > 0; col--) {
      /* get pixel value and index into the histogram */
      histp = &histogram[ptr[0] >> C0_SHIFT]
                        [ptr[1] >> C1_SHIFT]
                        [ptr[2] >> C2_SHIFT];
      /* increment, check for overflow and undo increment if so. */
      if (++(*histp) <= 0)
        (*histp)--;
      ptr += 3;
    }
  }
}